

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::AttributeEnd(ParsedScene *this,FileLoc loc)

{
  pointer *pppVar1;
  pointer pGVar2;
  pointer pTVar3;
  pointer puVar4;
  pointer ppVar5;
  RGBColorSpace *pRVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  int iVar38;
  int iVar39;
  char *pcVar40;
  GraphicsState *pGVar41;
  char vb;
  string ret;
  
  if (this->currentApiState == OptionsBlock) {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[13]>
              (&ret,"Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [13])0x4b9cae);
    Error(&loc,ret._M_dataplus._M_p);
LAB_00203921:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    return;
  }
  if (this->currentApiState == Uninitialized) {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[13]>
              (&ret,"pbrtInit() must be before calling \"%s()\". Ignoring.",(char (*) [13])0x4b9cae)
    ;
    Error(&loc,ret._M_dataplus._M_p);
    goto LAB_00203921;
  }
  pGVar2 = (this->pushedGraphicsStates).
           super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_start == pGVar2) {
    Error(&loc,"Unmatched AttributeEnd encountered. Ignoring it.");
    return;
  }
  pGVar41 = this->graphicsState;
  std::__cxx11::string::operator=((string *)pGVar41,(string *)(pGVar2 + -1));
  std::__cxx11::string::operator=
            ((string *)&pGVar41->currentOutsideMedium,(string *)&pGVar2[-1].currentOutsideMedium);
  pGVar41->currentMaterialIndex = pGVar2[-1].currentMaterialIndex;
  std::__cxx11::string::operator=
            ((string *)&pGVar41->currentMaterialName,(string *)&pGVar2[-1].currentMaterialName);
  std::__cxx11::string::operator=
            ((string *)&pGVar41->areaLightName,(string *)&pGVar2[-1].areaLightName);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&(pGVar41->areaLightParams).params,&pGVar2[-1].areaLightParams.params);
  (pGVar41->areaLightParams).colorSpace = pGVar2[-1].areaLightParams.colorSpace;
  pGVar41->reverseOrientation = pGVar2[-1].reverseOrientation;
  pcVar40 = pGVar2[-1].areaLightLoc.filename._M_str;
  iVar38 = pGVar2[-1].areaLightLoc.line;
  iVar39 = pGVar2[-1].areaLightLoc.column;
  pRVar6 = pGVar2[-1].colorSpace;
  (pGVar41->areaLightLoc).filename._M_len = pGVar2[-1].areaLightLoc.filename._M_len;
  (pGVar41->areaLightLoc).filename._M_str = pcVar40;
  (pGVar41->areaLightLoc).line = iVar38;
  (pGVar41->areaLightLoc).column = iVar39;
  pGVar41->colorSpace = pRVar6;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar41->shapeAttributes,&pGVar2[-1].shapeAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar41->lightAttributes,&pGVar2[-1].lightAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar41->materialAttributes,&pGVar2[-1].materialAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar41->mediumAttributes,&pGVar2[-1].mediumAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar41->textureAttributes,&pGVar2[-1].textureAttributes);
  pGVar41 = (this->pushedGraphicsStates).
            super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar41;
  GraphicsState::~GraphicsState(pGVar41);
  pTVar3 = (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (this->pushedActiveTransformBits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = *(undefined8 *)(pTVar3[-1].t[0].m.m[0] + 2);
  uVar8 = *(undefined8 *)pTVar3[-1].t[0].m.m[1];
  uVar9 = *(undefined8 *)(pTVar3[-1].t[0].m.m[1] + 2);
  uVar10 = *(undefined8 *)pTVar3[-1].t[0].m.m[2];
  uVar11 = *(undefined8 *)(pTVar3[-1].t[0].m.m[2] + 2);
  uVar12 = *(undefined8 *)pTVar3[-1].t[0].m.m[3];
  uVar13 = *(undefined8 *)(pTVar3[-1].t[0].m.m[3] + 2);
  uVar14 = *(undefined8 *)pTVar3[-1].t[0].mInv.m[0];
  uVar15 = *(undefined8 *)(pTVar3[-1].t[0].mInv.m[0] + 2);
  uVar16 = *(undefined8 *)pTVar3[-1].t[0].mInv.m[1];
  uVar17 = *(undefined8 *)(pTVar3[-1].t[0].mInv.m[1] + 2);
  uVar18 = *(undefined8 *)pTVar3[-1].t[0].mInv.m[2];
  uVar19 = *(undefined8 *)(pTVar3[-1].t[0].mInv.m[2] + 2);
  uVar20 = *(undefined8 *)pTVar3[-1].t[0].mInv.m[3];
  uVar21 = *(undefined8 *)(pTVar3[-1].t[0].mInv.m[3] + 2);
  uVar22 = *(undefined8 *)pTVar3[-1].t[1].m.m[0];
  uVar23 = *(undefined8 *)(pTVar3[-1].t[1].m.m[0] + 2);
  uVar24 = *(undefined8 *)pTVar3[-1].t[1].m.m[1];
  uVar25 = *(undefined8 *)(pTVar3[-1].t[1].m.m[1] + 2);
  uVar26 = *(undefined8 *)pTVar3[-1].t[1].m.m[2];
  uVar27 = *(undefined8 *)(pTVar3[-1].t[1].m.m[2] + 2);
  uVar28 = *(undefined8 *)pTVar3[-1].t[1].m.m[3];
  uVar29 = *(undefined8 *)(pTVar3[-1].t[1].m.m[3] + 2);
  uVar30 = *(undefined8 *)pTVar3[-1].t[1].mInv.m[0];
  uVar31 = *(undefined8 *)(pTVar3[-1].t[1].mInv.m[0] + 2);
  uVar32 = *(undefined8 *)pTVar3[-1].t[1].mInv.m[1];
  uVar33 = *(undefined8 *)(pTVar3[-1].t[1].mInv.m[1] + 2);
  uVar34 = *(undefined8 *)pTVar3[-1].t[1].mInv.m[2];
  uVar35 = *(undefined8 *)(pTVar3[-1].t[1].mInv.m[2] + 2);
  uVar36 = *(undefined8 *)pTVar3[-1].t[1].mInv.m[3];
  uVar37 = *(undefined8 *)(pTVar3[-1].t[1].mInv.m[3] + 2);
  *(undefined8 *)(this->curTransform).t[0].m.m[0] = *(undefined8 *)pTVar3[-1].t[0].m.m[0];
  *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2) = uVar7;
  *(undefined8 *)(this->curTransform).t[0].m.m[1] = uVar8;
  *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2) = uVar9;
  *(undefined8 *)(this->curTransform).t[0].m.m[2] = uVar10;
  *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2) = uVar11;
  *(undefined8 *)(this->curTransform).t[0].m.m[3] = uVar12;
  *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2) = uVar13;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[0] = uVar14;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2) = uVar15;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[1] = uVar16;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2) = uVar17;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[2] = uVar18;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2) = uVar19;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[3] = uVar20;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2) = uVar21;
  *(undefined8 *)(this->curTransform).t[1].m.m[0] = uVar22;
  *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2) = uVar23;
  *(undefined8 *)(this->curTransform).t[1].m.m[1] = uVar24;
  *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2) = uVar25;
  *(undefined8 *)(this->curTransform).t[1].m.m[2] = uVar26;
  *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2) = uVar27;
  *(undefined8 *)(this->curTransform).t[1].m.m[3] = uVar28;
  *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2) = uVar29;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[0] = uVar30;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2) = uVar31;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[1] = uVar32;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2) = uVar33;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[2] = uVar34;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2) = uVar35;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[3] = uVar36;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2) = uVar37;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar3 + -1;
  this->activeTransformBits = puVar4[-1];
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar4 + -1;
  ppVar5 = (this->pushStack).
           super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5[-1].first == 'o') {
    pcVar40 = "Mismatched nesting: open ObjectBegin from %s at AttributeEnd";
  }
  else {
    if (ppVar5[-1].first != 't') {
      ret._M_dataplus._M_p._0_1_ = ppVar5[-1].first;
      vb = 'a';
      if (ppVar5[-1].first != 'a') {
        LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parsedscene.cpp"
                   ,0xfb,"Check failed: %s == %s with %s = %s, %s = %s",
                   (char (*) [23])"pushStack.back().first",(char (*) [4])"\'a\'",
                   (char (*) [23])"pushStack.back().first",(char *)&ret,(char (*) [4])"\'a\'",&vb);
      }
      goto LAB_00203b48;
    }
    pcVar40 = "Mismatched nesting: open TransformBegin from %s at AttributeEnd";
  }
  SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
            (&this->super_SceneRepresentation,&loc,pcVar40,&ppVar5[-1].second);
LAB_00203b48:
  pppVar1 = &(this->pushStack).
             super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  return;
}

Assistant:

void ParsedScene::AttributeEnd(FileLoc loc) {
    VERIFY_WORLD("AttributeEnd");
    if (pushedGraphicsStates.empty()) {
        Error(&loc, "Unmatched AttributeEnd encountered. Ignoring it.");
        return;
    }

    // NOTE: must keep the following consistent with code in ObjectEnd
    *graphicsState = std::move(pushedGraphicsStates.back());
    pushedGraphicsStates.pop_back();

    curTransform = pushedTransforms.back();
    pushedTransforms.pop_back();
    activeTransformBits = pushedActiveTransformBits.back();
    pushedActiveTransformBits.pop_back();

    if (pushStack.back().first == 't')
        ErrorExitDeferred(
            &loc, "Mismatched nesting: open TransformBegin from %s at AttributeEnd",
            pushStack.back().second);
    else if (pushStack.back().first == 'o')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open ObjectBegin from %s at AttributeEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 'a');
    pushStack.pop_back();
}